

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

void test_secp256r1_sign(void)

{
  int iVar1;
  uECC_Curve curve;
  ptls_iovec_t input;
  undefined1 local_298 [8];
  uint32_t sigbuf_small [128];
  ptls_buffer_t sigbuf;
  uint8_t priv [32];
  uint8_t pub [65];
  char *msg;
  
  curve = uECC_secp256r1();
  uECC_make_key(priv + 0x18,(uint8_t *)&sigbuf.is_allocated,curve);
  ptls_buffer_init((ptls_buffer_t *)(sigbuf_small + 0x7e),local_298,0x200);
  input = ptls_iovec_init("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef",0x20);
  iVar1 = secp256r1sha256_sign(&sigbuf.is_allocated,(ptls_buffer_t *)(sigbuf_small + 0x7e),input);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/minicrypto.c",
      0x32);
  ptls_buffer_dispose((ptls_buffer_t *)(sigbuf_small + 0x7e));
  return;
}

Assistant:

static void test_secp256r1_sign(void)
{
    const char *msg = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
    uint8_t pub[SECP256R1_PUBLIC_KEY_SIZE], priv[SECP256R1_PRIVATE_KEY_SIZE];
    ptls_buffer_t sigbuf;
    uint32_t sigbuf_small[128];

    uECC_make_key(pub, priv, uECC_secp256r1());
    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));

    ok(secp256r1sha256_sign(priv, &sigbuf, ptls_iovec_init(msg, 32)) == 0);

    /* FIXME verify sign */

    ptls_buffer_dispose(&sigbuf);
}